

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_operators.cpp
# Opt level: O3

void __thiscall tst_qpromise_operators::equalTo(tst_qpromise_operators *this)

{
  QSharedData *pQVar1;
  QSharedData *pQVar2;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar3;
  char cVar4;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar5;
  char *pcVar6;
  char *pcVar7;
  bool bVar8;
  bool local_4d;
  bool local_4c [4];
  QPromise<int> p1;
  QPromise<int> p0;
  
  p1.super_QPromiseBase<int>._vptr_QPromiseBase =
       (_func_int **)CONCAT44(p1.super_QPromiseBase<int>._vptr_QPromiseBase._4_4_,0x2a);
  QtPromise::QPromiseBase<int>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:263:24),_0>
            (&p0.super_QPromiseBase<int>,(anon_class_8_1_a8c68091)&p1);
  p0.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011bba0;
  local_4c[0] = true;
  local_4c[1] = false;
  local_4c[2] = false;
  local_4c[3] = false;
  QtPromise::QPromiseBase<int>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:263:24),_0>
            (&p1.super_QPromiseBase<int>,(anon_class_8_1_a8c68091)local_4c);
  QVar3 = p1.super_QPromiseBase<int>.m_d;
  p1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011bba0;
  if (p1.super_QPromiseBase<int>.m_d.d == (PromiseData<int> *)0x0) {
    QVar5.d = (PromiseData<int> *)0x0;
  }
  else {
    LOCK();
    pQVar1 = &((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    LOCK();
    pQVar1 = &((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    QVar5 = p1.super_QPromiseBase<int>.m_d;
  }
  bVar8 = p0.super_QPromiseBase<int>.m_d.d == QVar5.d;
  local_4d = false;
  local_4c[0] = bVar8;
  pcVar6 = QTest::toString<bool>(local_4c);
  pcVar7 = QTest::toString<bool>(&local_4d);
  cVar4 = QTest::compare_helper
                    (!bVar8,"Compared values are not the same",pcVar6,pcVar7,"p0 == p1","false",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                     ,0x99);
  if (cVar4 != '\0') {
    local_4c[0] = p0.super_QPromiseBase<int>.m_d.d == QVar3.d;
    bVar8 = !local_4c[0];
    local_4d = false;
    pcVar6 = QTest::toString<bool>(local_4c);
    pcVar7 = QTest::toString<bool>(&local_4d);
    cVar4 = QTest::compare_helper
                      (bVar8,"Compared values are not the same",pcVar6,pcVar7,"p0 == p2","false",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                       ,0x9a);
    if (cVar4 != '\0') {
      local_4c[0] = p0.super_QPromiseBase<int>.m_d.d == QVar3.d;
      bVar8 = !local_4c[0];
      local_4d = false;
      pcVar6 = QTest::toString<bool>(local_4c);
      pcVar7 = QTest::toString<bool>(&local_4d);
      cVar4 = QTest::compare_helper
                        (bVar8,"Compared values are not the same",pcVar6,pcVar7,"p0 == p3","false",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                         ,0x9b);
      QVar5 = p1.super_QPromiseBase<int>.m_d;
      if (cVar4 != '\0') {
        local_4c[0] = p1.super_QPromiseBase<int>.m_d.d == QVar3.d;
        local_4d = true;
        pcVar6 = QTest::toString<bool>(local_4c);
        pcVar7 = QTest::toString<bool>(&local_4d);
        cVar4 = QTest::compare_helper
                          (QVar5.d == QVar3.d,"Compared values are not the same",pcVar6,pcVar7,
                           "p1 == p2","true",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                           ,0x9c);
        QVar5 = p1.super_QPromiseBase<int>.m_d;
        if (cVar4 != '\0') {
          local_4c[0] = p1.super_QPromiseBase<int>.m_d.d == QVar3.d;
          local_4d = true;
          pcVar6 = QTest::toString<bool>(local_4c);
          pcVar7 = QTest::toString<bool>(&local_4d);
          cVar4 = QTest::compare_helper
                            (QVar5.d == QVar3.d,"Compared values are not the same",pcVar6,pcVar7,
                             "p1 == p3","true",
                             "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                             ,0x9d);
          if (cVar4 != '\0') {
            local_4c[0] = true;
            local_4d = true;
            pcVar6 = QTest::toString<bool>(local_4c);
            pcVar7 = QTest::toString<bool>(&local_4d);
            QTest::compare_helper
                      (true,"Compared values are not the same",pcVar6,pcVar7,"p2 == p3","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_operators.cpp"
                       ,0x9e);
          }
        }
      }
    }
  }
  if (QVar3.d != (PromiseData<int> *)0x0) {
    pQVar1 = &((QVar3.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    LOCK();
    pQVar2 = &((QVar3.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      (*((QVar3.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])
                (QVar3.d);
    }
    LOCK();
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i == 0) {
      (*((QVar3.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])
                (QVar3.d);
    }
  }
  p1.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011ba68;
  if (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p1.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p1.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  p0.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_0011ba68;
  if (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (p0.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((p0.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_qpromise_operators::equalTo()
{
    auto p0 = QtPromise::QPromise<int>::resolve(42);
    auto p1 = QtPromise::QPromise<int>::resolve(42);
    auto p2 = p1;
    auto p3(p2);

    QCOMPARE(p0 == p1, false);
    QCOMPARE(p0 == p2, false);
    QCOMPARE(p0 == p3, false);
    QCOMPARE(p1 == p2, true);
    QCOMPARE(p1 == p3, true);
    QCOMPARE(p2 == p3, true);
}